

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O1

double __thiscall HighsPseudocost::getScoreUp(HighsPseudocost *this,HighsInt col,double frac)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pdVar2 = (this->inferencesup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = (this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  pdVar6 = (this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + col;
  if (iVar1 == 0) {
    pdVar6 = &this->cost_total;
  }
  dVar7 = ceil(frac);
  dVar8 = this->cost_total;
  if (dVar8 <= 1e-06) {
    dVar8 = 1e-06;
  }
  dVar10 = (double)(this->ncutoffsup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
  dVar11 = (double)iVar1 + dVar10;
  if (dVar11 <= 1.0) {
    dVar11 = 1.0;
  }
  dVar12 = (double)this->nsamplestotal + (double)this->ncutoffstotal;
  if (dVar12 <= 1.0) {
    dVar12 = 1.0;
  }
  auVar9._8_8_ = (double)this->ncutoffstotal / dVar12;
  auVar9._0_8_ = this->inferences_total;
  pdVar3 = (this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->conflictscoreup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  lVar5 = lVar4 >> 3;
  auVar15._8_4_ = (int)(lVar4 >> 0x23);
  auVar15._0_8_ = lVar5;
  auVar15._12_4_ = 0x45300000;
  dVar12 = this->conflict_avg_score /
           (((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * this->conflict_weight)
  ;
  if (dVar12 <= 1e-06) {
    dVar12 = 1e-06;
  }
  auVar9 = maxpd(auVar9,_DAT_003d7270);
  auVar13._8_8_ = dVar10 / dVar11;
  auVar13._0_8_ = pdVar2[col];
  auVar9 = divpd(auVar13,auVar9);
  auVar14._0_8_ = auVar9._0_8_ + (double)DAT_003c93e0;
  auVar14._8_8_ = auVar9._8_8_ + DAT_003c93e0._8_8_;
  auVar9 = divpd(_DAT_003c93e0,auVar14);
  return (1.0 - 1.0 / ((pdVar3[col] / this->conflict_weight) / dVar12 + 1.0)) * 0.01 +
         ((DAT_003c93e0._8_8_ - auVar9._8_8_) + ((double)DAT_003c93e0 - auVar9._0_8_)) * 0.0001 +
         (1.0 - 1.0 / (((dVar7 - frac) * *pdVar6) / dVar8 + 1.0));
}

Assistant:

double getScoreUp(HighsInt col, double frac) const {
    double costScore = getPseudocostUp(col, frac) / std::max(1e-6, cost_total);
    double inferenceScore =
        inferencesup[col] / std::max(1e-6, inferences_total);

    double cutOffScoreUp =
        ncutoffsup[col] /
        std::max(1.0, static_cast<double>(ncutoffsup[col]) +
                          static_cast<double>(nsamplesup[col]));
    double avgCutoffs = static_cast<double>(ncutoffstotal) /
                        std::max(1.0, static_cast<double>(ncutoffstotal) +
                                          static_cast<double>(nsamplestotal));

    double cutoffScore = cutOffScoreUp / std::max(1e-6, avgCutoffs);

    double conflictScoreUp = conflictscoreup[col] / conflict_weight;
    double conflictScoreAvg =
        conflict_avg_score /
        (conflict_weight * static_cast<double>(conflictscoreup.size()));
    double conflictScore = conflictScoreUp / std::max(1e-6, conflictScoreAvg);

    auto mapScore = [](double score) { return 1.0 - 1.0 / (1.0 + score); };

    return mapScore(costScore) +
           (1e-2 * mapScore(conflictScore) +
            1e-4 * (mapScore(cutoffScore) + mapScore(inferenceScore)));
  }